

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,sdf_tools::real3,sdf_tools::real3,float,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul>(void *param_1,long param_2)

{
  bool bVar1;
  vector<bool,_std::allocator<bool>_> *this;
  reference pvVar2;
  handle hVar3;
  type_caster_generic *this_00;
  reference rVar4;
  undefined8 in_stack_ffffffffffffff40;
  undefined1 uVar5;
  type_caster_generic *in_stack_ffffffffffffff48;
  handle in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff68;
  byte bVar6;
  _Bit_reference in_stack_ffffffffffffff70;
  undefined1 convert;
  type_caster<float,_void> *in_stack_ffffffffffffff80;
  reference local_60;
  PyObject *local_50;
  reference local_48;
  PyObject *local_38;
  reference local_30;
  PyObject *local_20;
  long local_18;
  void *local_10;
  
  convert = in_stack_ffffffffffffff70._M_mask._7_1_;
  uVar5 = (undefined1)((ulong)in_stack_ffffffffffffff40 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  this = (vector<bool,_std::allocator<bool>_> *)
         std::
         get<0ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                   ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                     *)0x1789e9);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_20 = pvVar2->m_ptr;
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(size_type)param_1);
  std::_Bit_reference::operator_cast_to_bool(&local_30);
  bVar1 = type_caster<pybind11::detail::value_and_holder,_void>::load
                    ((type_caster<pybind11::detail::value_and_holder,_void> *)
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,(bool)uVar5);
  bVar6 = 1;
  if (bVar1) {
    hVar3.m_ptr = (PyObject *)
                  std::
                  get<1ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                            ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                              *)0x178a74);
    pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                       ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                        (local_18 + 8),1);
    local_38 = pvVar2->m_ptr;
    local_48 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(size_type)param_1);
    std::_Bit_reference::operator_cast_to_bool(&local_48);
    bVar1 = type_caster_generic::load(in_stack_ffffffffffffff48,hVar3,(bool)uVar5);
    bVar6 = 1;
    if (bVar1) {
      this_00 = (type_caster_generic *)
                std::
                get<2ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                          ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                            *)0x178b01);
      pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                         ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                          (local_18 + 8),2);
      local_50 = pvVar2->m_ptr;
      local_60 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(size_type)param_1);
      std::_Bit_reference::operator_cast_to_bool(&local_60);
      bVar1 = type_caster_generic::load(this_00,hVar3,(bool)uVar5);
      bVar6 = 1;
      if (bVar1) {
        std::
        get<3ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                  ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                    *)0x178b7f);
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),3);
        rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(size_type)param_1);
        hVar3.m_ptr = (PyObject *)rVar4._M_p;
        std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff88);
        bVar1 = type_caster<float,_void>::load(in_stack_ffffffffffffff80,hVar3,(bool)convert);
        bVar6 = 1;
        if (bVar1) {
          std::
          get<4ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                    ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                      *)0x178bfa);
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),4
                    );
          std::vector<bool,_std::allocator<bool>_>::operator[](this,(size_type)param_1);
          uVar5 = (undefined1)((ulong)param_1 >> 0x38);
          std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff70);
          hVar3.m_ptr._7_1_ = bVar6;
          hVar3.m_ptr._0_7_ = in_stack_ffffffffffffff68;
          bVar1 = type_caster<bool,_void>::load((type_caster<bool,_void> *)this,hVar3,(bool)uVar5);
          bVar6 = bVar1 ^ 0xff;
        }
      }
    }
  }
  return (bVar6 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }